

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O0

int coda_mem_cursor_get_num_elements(coda_cursor *cursor,long *num_elements)

{
  coda_dynamic_type_struct *pcVar1;
  int iVar2;
  coda_mem_type *type;
  long *num_elements_local;
  coda_cursor *cursor_local;
  
  pcVar1 = cursor->stack[cursor->n + -1].type;
  switch(pcVar1[1].backend) {
  case coda_backend_ascii:
    *num_elements = *(long *)(cursor->stack[cursor->n + -1].type + 2);
    break;
  case coda_backend_binary:
    *num_elements = *(long *)(cursor->stack[cursor->n + -1].type + 2);
    break;
  case 2:
    if (pcVar1->definition->format == coda_format_ascii) {
      iVar2 = coda_ascii_cursor_get_num_elements(cursor,num_elements);
      return iVar2;
    }
    iVar2 = coda_bin_cursor_get_num_elements(cursor,num_elements);
    return iVar2;
  case 3:
    *num_elements = 1;
  }
  return 0;
}

Assistant:

int coda_mem_cursor_get_num_elements(const coda_cursor *cursor, long *num_elements)
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;

    switch (type->tag)
    {
        case tag_mem_record:
            *num_elements = ((coda_mem_record *)cursor->stack[cursor->n - 1].type)->num_fields;
            break;
        case tag_mem_array:
            *num_elements = ((coda_mem_array *)cursor->stack[cursor->n - 1].type)->num_elements;
            break;
        case tag_mem_data:
            if (type->definition->format == coda_format_ascii)
            {
                return coda_ascii_cursor_get_num_elements(cursor, num_elements);
            }
            return coda_bin_cursor_get_num_elements(cursor, num_elements);
        case tag_mem_special:
            *num_elements = 1;
            break;
    }
    return 0;
}